

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpf_common_sse2.h
# Opt level: O0

void highbd_transpose4x8_8x4_high_sse2
               (__m128i *x0,__m128i *x1,__m128i *x2,__m128i *x3,__m128i *d4,__m128i *d5,__m128i *d6,
               __m128i *d7)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  __m128i alVar4;
  __m128i zero;
  __m128i ww3;
  __m128i ww2;
  __m128i w1;
  __m128i w0;
  __m128i *d5_local;
  __m128i *d4_local;
  __m128i *x3_local;
  __m128i *x2_local;
  __m128i *x1_local;
  __m128i *x0_local;
  
  auVar1 = vpunpckhwd_avx((undefined1  [16])*x0,(undefined1  [16])*x1);
  auVar2 = vpunpckhwd_avx((undefined1  [16])*x2,(undefined1  [16])*x3);
  auVar3 = vpunpckldq_avx(auVar1,auVar2);
  auVar1 = vpunpckhdq_avx(auVar1,auVar2);
  alVar4 = (__m128i)vpunpcklqdq_avx(auVar3,ZEXT816(0));
  *d4 = alVar4;
  alVar4 = (__m128i)vpunpckhqdq_avx(auVar3,ZEXT816(0));
  *d5 = alVar4;
  alVar4 = (__m128i)vpunpcklqdq_avx(auVar1,ZEXT816(0));
  *d6 = alVar4;
  alVar4 = (__m128i)vpunpckhqdq_avx(auVar1,ZEXT816(0));
  *d7 = alVar4;
  return;
}

Assistant:

static inline void highbd_transpose4x8_8x4_high_sse2(__m128i *x0, __m128i *x1,
                                                     __m128i *x2, __m128i *x3,
                                                     __m128i *d4, __m128i *d5,
                                                     __m128i *d6, __m128i *d7) {
  __m128i w0, w1, ww2, ww3;
  __m128i zero = _mm_setzero_si128();

  w0 = _mm_unpackhi_epi16(*x0, *x1);  // 04 14 05 15 06 16 07 17
  w1 = _mm_unpackhi_epi16(*x2, *x3);  // 24 34 25 35 26 36 27 37

  ww2 = _mm_unpacklo_epi32(w0, w1);  //  04 14 24 34 05 15 25 35
  ww3 = _mm_unpackhi_epi32(w0, w1);  //  06 16 26 36 07 17 27 37

  *d4 = _mm_unpacklo_epi64(ww2, zero);  // 04 14 24 34 xx xx xx xx
  *d5 = _mm_unpackhi_epi64(ww2, zero);  // 05 15 25 35 xx xx xx xx
  *d6 = _mm_unpacklo_epi64(ww3, zero);  // 06 16 26 36 xx xx xx xx
  *d7 = _mm_unpackhi_epi64(ww3, zero);  // 07 17 27 37 xx xx xx xx
}